

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::SelectUtxoData::ConvertFromStruct
          (SelectUtxoData *this,SelectUtxoDataStruct *data)

{
  SelectUtxoDataStruct *data_local;
  SelectUtxoData *this_local;
  
  std::__cxx11::string::operator=((string *)&this->txid_,(string *)data);
  this->vout_ = data->vout;
  std::__cxx11::string::operator=((string *)&this->asset_,(string *)&data->asset);
  std::__cxx11::string::operator=((string *)&this->redeem_script_,(string *)&data->redeem_script);
  std::__cxx11::string::operator=((string *)&this->descriptor_,(string *)&data->descriptor);
  this->is_issuance_ = (bool)(data->is_issuance & 1);
  this->is_blind_issuance_ = (bool)(data->is_blind_issuance & 1);
  this->is_pegin_ = (bool)(data->is_pegin & 1);
  this->pegin_btc_tx_size_ = data->pegin_btc_tx_size;
  this->pegin_tx_out_proof_size_ = data->pegin_tx_out_proof_size;
  std::__cxx11::string::operator=((string *)&this->claim_script_,(string *)&data->claim_script);
  std::__cxx11::string::operator=((string *)&this->fedpeg_script_,(string *)&data->fedpeg_script);
  std::__cxx11::string::operator=
            ((string *)&this->script_sig_template_,(string *)&data->script_sig_template);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void SelectUtxoData::ConvertFromStruct(
    const SelectUtxoDataStruct& data) {
  txid_ = data.txid;
  vout_ = data.vout;
  asset_ = data.asset;
  redeem_script_ = data.redeem_script;
  descriptor_ = data.descriptor;
  is_issuance_ = data.is_issuance;
  is_blind_issuance_ = data.is_blind_issuance;
  is_pegin_ = data.is_pegin;
  pegin_btc_tx_size_ = data.pegin_btc_tx_size;
  pegin_tx_out_proof_size_ = data.pegin_tx_out_proof_size;
  claim_script_ = data.claim_script;
  fedpeg_script_ = data.fedpeg_script;
  script_sig_template_ = data.script_sig_template;
  ignore_items = data.ignore_items;
}